

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_mutex * sqlite3_mutex_alloc(int id)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  
  if (id < 2) {
    iVar1 = sqlite3_initialize();
  }
  else {
    iVar1 = sqlite3MutexInit();
  }
  if (iVar1 != 0) {
    return (sqlite3_mutex *)0x0;
  }
  psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(id);
  return psVar2;
}

Assistant:

SQLITE_API sqlite3_mutex *sqlite3_mutex_alloc(int id){
#ifndef SQLITE_OMIT_AUTOINIT
  if( id<=SQLITE_MUTEX_RECURSIVE && sqlite3_initialize() ) return 0;
  if( id>SQLITE_MUTEX_RECURSIVE && sqlite3MutexInit() ) return 0;
#endif
  assert( sqlite3GlobalConfig.mutex.xMutexAlloc );
  return sqlite3GlobalConfig.mutex.xMutexAlloc(id);
}